

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer.cpp
# Opt level: O1

void __thiscall bidfx_public_api::tools::ByteBuffer::Compact(ByteBuffer *this)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar2 = this->reader_index_;
  uVar4 = this->writer_index_;
  if (uVar2 < uVar4) {
    lVar3 = 0;
    do {
      this->buf_[lVar3] = this->buf_[uVar2 + lVar3];
      uVar4 = this->writer_index_;
      lVar1 = uVar2 + lVar3;
      lVar3 = lVar3 + 1;
    } while (lVar1 + 1U < uVar4);
  }
  this->writer_index_ = uVar4 - this->reader_index_;
  this->reader_index_ = 0;
  return;
}

Assistant:

void ByteBuffer::Compact()
{
    int count = 0;
    for (size_t i = reader_index_; i < writer_index_; i++)
    {
        buf_[count] = buf_[i];
        count++;
    }
    writer_index_ -= reader_index_;
    reader_index_ = 0;
}